

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

int VP8LDecodeAlphaHeader(ALPHDecoder *alph_dec,uint8_t *data,size_t data_size)

{
  int iVar1;
  uint uVar2;
  HTreeGroup *pHVar3;
  long lVar4;
  int iVar5;
  VP8LDecoder *dec;
  long lVar6;
  uint32_t *puVar7;
  
  dec = VP8LNew();
  if (dec != (VP8LDecoder *)0x0) {
    iVar5 = alph_dec->width;
    dec->width = iVar5;
    iVar1 = alph_dec->height;
    dec->height = iVar1;
    dec->io = &alph_dec->io;
    (alph_dec->io).opaque = alph_dec;
    (alph_dec->io).width = iVar5;
    (alph_dec->io).height = iVar1;
    dec->status = VP8_STATUS_OK;
    VP8LInitBitReader(&dec->br,data,data_size);
    iVar5 = DecodeImageStream(alph_dec->width,alph_dec->height,1,dec,(uint32_t **)0x0);
    if (iVar5 != 0) {
      if (((dec->next_transform == 1) && (dec->transforms[0].type == COLOR_INDEXING_TRANSFORM)) &&
         ((dec->hdr).color_cache_size < 1)) {
        uVar2 = (dec->hdr).num_htree_groups;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        lVar6 = 0;
        do {
          if ((ulong)uVar2 * 0x238 + 0x238 == lVar6 + 0x238) {
            alph_dec->use_8b_decode = 1;
            dec->argb_cache = (uint32_t *)0x0;
            puVar7 = (uint32_t *)WebPSafeMalloc((long)dec->height * (long)dec->width,1);
            dec->pixels = puVar7;
            if (puVar7 != (uint32_t *)0x0) goto LAB_0010d573;
            if ((dec->status == VP8_STATUS_SUSPENDED) || (dec->status == VP8_STATUS_OK)) {
              dec->status = VP8_STATUS_OUT_OF_MEMORY;
            }
            goto LAB_0010d620;
          }
          pHVar3 = (dec->hdr).htree_groups;
        } while (((**(char **)((long)pHVar3->htrees + lVar6 + 8) == '\0') &&
                 (**(char **)((long)pHVar3->htrees + lVar6 + 0x10) == '\0')) &&
                (lVar4 = lVar6 + 0x18, lVar6 = lVar6 + 0x238,
                **(char **)((long)pHVar3->htrees + lVar4) == '\0'));
      }
      alph_dec->use_8b_decode = 0;
      iVar5 = AllocateInternalBuffers32b(dec,alph_dec->width);
      if (iVar5 != 0) {
LAB_0010d573:
        alph_dec->vp8l_dec = dec;
        return 1;
      }
    }
LAB_0010d620:
    VP8LDelete(dec);
  }
  return 0;
}

Assistant:

int VP8LDecodeAlphaHeader(ALPHDecoder* const alph_dec,
                          const uint8_t* const data, size_t data_size) {
  int ok = 0;
  VP8LDecoder* dec = VP8LNew();

  if (dec == NULL) return 0;

  assert(alph_dec != NULL);

  dec->width = alph_dec->width;
  dec->height = alph_dec->height;
  dec->io = &alph_dec->io;
  dec->io->opaque = alph_dec;
  dec->io->width = alph_dec->width;
  dec->io->height = alph_dec->height;

  dec->status = VP8_STATUS_OK;
  VP8LInitBitReader(&dec->br, data, data_size);

  if (!DecodeImageStream(alph_dec->width, alph_dec->height, /*is_level0=*/1,
                         dec, /*decoded_data=*/NULL)) {
    goto Err;
  }

  // Special case: if alpha data uses only the color indexing transform and
  // doesn't use color cache (a frequent case), we will use DecodeAlphaData()
  // method that only needs allocation of 1 byte per pixel (alpha channel).
  if (dec->next_transform == 1 &&
      dec->transforms[0].type == COLOR_INDEXING_TRANSFORM &&
      Is8bOptimizable(&dec->hdr)) {
    alph_dec->use_8b_decode = 1;
    ok = AllocateInternalBuffers8b(dec);
  } else {
    // Allocate internal buffers (note that dec->width may have changed here).
    alph_dec->use_8b_decode = 0;
    ok = AllocateInternalBuffers32b(dec, alph_dec->width);
  }

  if (!ok) goto Err;

  // Only set here, once we are sure it is valid (to avoid thread races).
  alph_dec->vp8l_dec = dec;
  return 1;

 Err:
  VP8LDelete(dec);
  return 0;
}